

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

void __thiscall Function::~Function(Function *this)

{
  int *piVar1;
  Function *pFVar2;
  
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_00155070;
  pFVar2 = this->xLeft;
  if (pFVar2 != (Function *)0x0) {
    piVar1 = &pFVar2->functionUseCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      (*(pFVar2->super_Physical)._vptr_Physical[1])();
    }
  }
  pFVar2 = this->xRight;
  if (pFVar2 != (Function *)0x0) {
    piVar1 = &pFVar2->functionUseCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      (*(pFVar2->super_Physical)._vptr_Physical[1])();
    }
  }
  pFVar2 = this->xPlus;
  if (pFVar2 != (Function *)0x0) {
    piVar1 = &pFVar2->functionUseCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      (*(pFVar2->super_Physical)._vptr_Physical[1])();
    }
  }
  std::__cxx11::string::~string((string *)&this->sName);
  std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
            (&(this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>);
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

Function::~Function()
{
	if (xLeft) {
		xLeft->functionUseCount--;
		if (xLeft->functionUseCount)
			delete xLeft;
	}
	if (xRight) {
		xRight->functionUseCount--;
		if (xRight->functionUseCount)
			delete xRight;
	}
	if (xPlus) {
		xPlus->functionUseCount--;
		if (xPlus->functionUseCount)
			delete xPlus;
	}
}